

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convergence_study4.cc
# Opt level: O0

int main(void)

{
  double *pdVar1;
  double *pdVar2;
  anon_class_16_2_c95e541f *__val;
  initializer_list<double> __l;
  anon_class_16_2_c95e541e *paVar3;
  bool bVar4;
  reference pdVar5;
  reference ptVar6;
  undefined4 local_618;
  undefined4 uStack_614;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  double *local_5f8;
  anon_class_16_2_c95e541f *local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  double *pdStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  anon_class_16_2_c95e541f **local_5b0;
  uint local_5a8;
  ostream *local_598;
  ostream *local_590;
  ostream *local_588;
  ostream *local_580;
  ostream *local_578;
  ostream *local_570;
  tuple<int,_double,_double,_double> *local_568;
  ostream *local_560;
  undefined1 *local_558;
  size_type local_550;
  RefElType local_549;
  ostream *local_548;
  ostream *local_540;
  ostream *local_538;
  allocator_type *local_530;
  double *local_528;
  type *errorestimator;
  type *error_s;
  type *error_u;
  type_conflict *dofs;
  _Head_base<2UL,_double,_false> _Stack_500;
  _Head_base<1UL,_double,_false> local_4f8;
  undefined8 uStack_4f0;
  __normal_iterator<std::tuple<int,_double,_double,_double>_*,_std::vector<std::tuple<int,_double,_double,_double>,_std::allocator<std::tuple<int,_double,_double,_double>_>_>_>
  local_4e8;
  iterator __end2;
  iterator __begin2;
  energy_vector_ultraweak *__range2;
  ofstream file;
  string local_2d0;
  undefined1 local_2b0 [8];
  string file_name;
  undefined4 uStack_214;
  undefined1 local_1d0 [8];
  energy_vector_ultraweak errors;
  int delta_p;
  int deg_p;
  anon_class_1_0_00000001_for_g_ g;
  anon_class_72_9_e57ca9ac f;
  anon_class_16_2_f9f03c7a beta;
  anon_class_8_1_ba1d4488 epsilon;
  anon_class_40_5_d35d41c8 sigma;
  anon_class_16_2_10875f5a_for_f_ u_exact;
  anon_class_16_2_c95e541f u2_exact_d2;
  anon_class_16_2_c95e541f u2_exact_grad;
  anon_class_16_2_c95e541f u2_exact;
  anon_class_16_2_c95e541e u1_exact_d2;
  anon_class_16_2_c95e541e u1_exact_grad;
  anon_class_16_2_c95e541e u1_exact;
  double eps;
  const_iterator __end1;
  const_iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  double b2;
  double b1;
  allocator<double> local_69;
  double local_68 [6];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> epsilon_values;
  
  epsilon_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._4_4_ = 0;
  local_538 = (ostream *)&std::cout;
  std::operator<<((ostream *)&std::cout,
                  "Convergence study 4: Ultraweak DPG method, solution with a boundary layer  \n");
  std::operator<<(local_538,"Solution develops a boundary layer at top and right edge. \n");
  local_68[4] = 0.02;
  local_68[5] = 0.01;
  local_68[2] = 0.1;
  local_68[3] = 0.05;
  local_68[0] = 1.0;
  local_68[1] = 0.5;
  local_38 = local_68;
  local_30 = 6;
  local_530 = &local_69;
  std::allocator<double>::allocator(local_530);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,__l,local_530);
  std::allocator<double>::~allocator(&local_69);
  __end1 = std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_28);
  eps = (double)std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)local_28);
  while( true ) {
    bVar4 = __gnu_cxx::operator==<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      (&__end1,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&eps);
    if (((bVar4 ^ 0xffU) & 1) == 0) break;
    pdVar5 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    __val = (anon_class_16_2_c95e541f *)*pdVar5;
    u1_exact_grad.eps = 2.0;
    u1_exact_d2.eps = 2.0;
    u2_exact.eps = 1.0;
    u2_exact_grad.eps = 1.0;
    u2_exact_d2.eps = 1.0;
    pdVar1 = &u1_exact_grad.b1;
    pdVar2 = &u2_exact_grad.b2;
    errors.
    super__Vector_base<std::tuple<int,_double,_double,_double>,_std::allocator<std::tuple<int,_double,_double,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
    u_exact.u1_exact = (anon_class_16_2_c95e541e *)pdVar2;
    u_exact.u2_exact = __val;
    u2_exact_d2.b2 = (double)__val;
    u2_exact_grad.b2 = (double)__val;
    u2_exact.b2 = (double)__val;
    u1_exact_d2.b1 = (double)__val;
    u1_exact_grad.b1 = (double)__val;
    local_540 = std::operator<<((ostream *)&std::cout,
                                "Running convergence tests on a triangular mesh  (eps= ");
    local_548 = (ostream *)std::ostream::operator<<(local_540,(double)__val);
    std::operator<<(local_548,")\n");
    paVar3 = u_exact.u1_exact;
    local_550 = reflev;
    local_549 = (RefElType)lf::base::RefEl::kTria();
    local_618 = SUB84(__val,0);
    local_5e0 = 0x3ff0000000000000;
    uStack_5e8 = 0x4000000000000000;
    uStack_214 = (undefined4)((ulong)__val >> 0x20);
    uStack_614 = uStack_214;
    local_5a8 = (uint)local_549;
    local_5f8 = &u2_exact_d2.b2;
    local_5f0 = __val;
    pdStack_5d8 = pdVar1;
    local_5b0 = &u_exact.u2_exact;
    local_558 = (undefined1 *)&local_618;
    file_name.field_2._M_local_buf[0xe] = local_549;
    local_5d0 = &u1_exact_d2.b1;
    uStack_5c8 = &u2_exact.b2;
    local_5c0 = pdVar2;
    uStack_5b8 = &u2_exact_d2.b2;
    uStack_610 = pdVar1;
    uStack_600 = &u1_exact_d2.b1;
    local_608 = pdVar2;
    projects::dpg::test::
    TestConververgenceUltraWeakDPGConvectionDiffusionDirichletBVP<main::__0,main::__1,main::__2,main::__3,main::__4,main::__5>
              (local_618,(test *)0x0,0,local_1d0,local_550,pdVar1,paVar3,1,2);
    std::__cxx11::to_string(&local_2d0,(double)__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                   "cs4/",&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::ofstream::ofstream(&__range2,local_2b0,0x10);
    __end2 = std::
             vector<std::tuple<int,_double,_double,_double>,_std::allocator<std::tuple<int,_double,_double,_double>_>_>
             ::begin((vector<std::tuple<int,_double,_double,_double>,_std::allocator<std::tuple<int,_double,_double,_double>_>_>
                      *)local_1d0);
    local_4e8._M_current =
         (tuple<int,_double,_double,_double> *)
         std::
         vector<std::tuple<int,_double,_double,_double>,_std::allocator<std::tuple<int,_double,_double,_double>_>_>
         ::end((vector<std::tuple<int,_double,_double,_double>,_std::allocator<std::tuple<int,_double,_double,_double>_>_>
                *)local_1d0);
    while( true ) {
      bVar4 = __gnu_cxx::
              operator==<std::tuple<int,_double,_double,_double>_*,_std::vector<std::tuple<int,_double,_double,_double>,_std::allocator<std::tuple<int,_double,_double,_double>_>_>_>
                        (&__end2,&local_4e8);
      if (((bVar4 ^ 0xffU) & 1) == 0) break;
      ptVar6 = __gnu_cxx::
               __normal_iterator<std::tuple<int,_double,_double,_double>_*,_std::vector<std::tuple<int,_double,_double,_double>,_std::allocator<std::tuple<int,_double,_double,_double>_>_>_>
               ::operator*(&__end2);
      dofs = (type_conflict *)
             (ptVar6->super__Tuple_impl<0UL,_int,_double,_double,_double>).
             super__Tuple_impl<1UL,_double,_double,_double>.super__Tuple_impl<2UL,_double,_double>.
             super__Tuple_impl<3UL,_double>.super__Head_base<3UL,_double,_false>._M_head_impl;
      _Stack_500._M_head_impl =
           (ptVar6->super__Tuple_impl<0UL,_int,_double,_double,_double>).
           super__Tuple_impl<1UL,_double,_double,_double>.super__Tuple_impl<2UL,_double,_double>.
           super__Head_base<2UL,_double,_false>._M_head_impl;
      local_4f8._M_head_impl =
           (ptVar6->super__Tuple_impl<0UL,_int,_double,_double,_double>).
           super__Tuple_impl<1UL,_double,_double,_double>.super__Head_base<1UL,_double,_false>.
           _M_head_impl;
      uStack_4f0._0_4_ =
           (ptVar6->super__Tuple_impl<0UL,_int,_double,_double,_double>).
           super__Head_base<0UL,_int,_false>._M_head_impl;
      uStack_4f0._4_4_ =
           *(undefined4 *)&(ptVar6->super__Tuple_impl<0UL,_int,_double,_double,_double>).field_0x1c;
      local_568 = (tuple<int,_double,_double,_double> *)&dofs;
      error_u = (type *)std::get<0ul,int,double,double,double>(local_568);
      error_s = std::get<1ul,int,double,double,double>(local_568);
      errorestimator = std::get<2ul,int,double,double,double>(local_568);
      local_528 = std::get<3ul,int,double,double,double>(local_568);
      local_560 = (ostream *)std::ostream::operator<<(&__range2,*(int *)error_u);
      local_570 = std::operator<<(local_560,", ");
      local_578 = (ostream *)std::ostream::operator<<(local_570,*error_s);
      local_580 = std::operator<<(local_578,", ");
      local_588 = (ostream *)std::ostream::operator<<(local_580,*errorestimator);
      local_590 = std::operator<<(local_588,", ");
      local_598 = (ostream *)std::ostream::operator<<(local_590,*local_528);
      std::operator<<(local_598,'\n');
      __gnu_cxx::
      __normal_iterator<std::tuple<int,_double,_double,_double>_*,_std::vector<std::tuple<int,_double,_double,_double>,_std::allocator<std::tuple<int,_double,_double,_double>_>_>_>
      ::operator++(&__end2);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&__range2);
    std::__cxx11::string::~string((string *)local_2b0);
    std::
    vector<std::tuple<int,_double,_double,_double>,_std::allocator<std::tuple<int,_double,_double,_double>_>_>
    ::~vector((vector<std::tuple<int,_double,_double,_double>,_std::allocator<std::tuple<int,_double,_double,_double>_>_>
               *)local_1d0);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  epsilon_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._4_4_ = 0;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return epsilon_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
  std::cout << "Convergence study 4: Ultraweak DPG method, solution with a "
               "boundary layer  \n";
  std::cout << "Solution develops a boundary layer at top and right edge. \n";

  const std::vector<double> epsilon_values = {1, 0.5, 0.1, 0.05, 0.02, 0.01};
  const double b1 = 2.0;
  const double b2 = 1.0;

  for (const double eps : epsilon_values) {
    //------------------------
    // Specification of the BVP
    //------------------------
    // exact solution:
    auto u1_exact = [eps, b1](double x) -> double {
      return x + (std::exp(x * b1 / eps) - 1) / (1 - std::exp(b1 / eps));
    };
    auto u1_exact_grad = [eps, b1](double x) -> double {
      return 1 + b1 / eps * std::exp(x * b1 / eps) / (1 - std::exp(b1 / eps));
    };
    auto u1_exact_d2 = [eps, b1](double x) -> double {
      return b1 * b1 / (eps * eps) * std::exp(x * b1 / eps) /
             (1 - std::exp(b1 / eps));
    };

    auto u2_exact = [eps, b2](double y) -> double {
      return y + (std::exp(y * b2 / eps) - 1) / (1 - std::exp(b2 / eps));
    };
    auto u2_exact_grad = [eps, b2](double y) -> double {
      return 1 + b2 / eps * std::exp(y * b2 / eps) / (1 - std::exp(b2 / eps));
    };
    auto u2_exact_d2 = [eps, b2](double y) -> double {
      return b2 * b2 / (eps * eps) * std::exp(y * b2 / eps) /
             (1 - std::exp(b2 / eps));
    };

    auto u_exact = [&u1_exact, &u2_exact](const Eigen::Vector2d& x) -> double {
      return u1_exact(x[0]) * u2_exact(x[1]);
    };
    auto sigma = [eps, &u1_exact, &u2_exact, &u1_exact_grad,
                  &u2_exact_grad](const Eigen::Vector2d& x) -> Eigen::Vector2d {
      return (Eigen::VectorXd(2) << eps * u1_exact_grad(x[0]) * u2_exact(x[1]),
              eps * u1_exact(x[0]) * u2_exact_grad(x[1]))
          .finished();
    };

    auto epsilon = [eps](const Eigen::Vector2d& /*x*/) -> double {
      return eps;
    };
    auto beta = [b1, b2](const Eigen::Vector2d& /*x*/) -> Eigen::Vector2d {
      return (Eigen::VectorXd(2) << b1, b2).finished();
    };

    auto f = [eps, b1, b2, &u1_exact, &u1_exact_grad, &u1_exact_d2, &u2_exact,
              &u2_exact_grad,
              &u2_exact_d2](const Eigen::Vector2d& x) -> double {
      return -eps * (u1_exact_d2(x[0]) * u2_exact(x[1]) +
                     u1_exact(x[0]) * u2_exact_d2(x[1])) +
             b1 * u1_exact_grad(x[0]) * u2_exact(x[1]) +
             b2 * u1_exact(x[0]) * u2_exact_grad(x[1]);
    };
    auto g = [](const Eigen::Vector2d& /*x*/) -> double { return 0.0; };

    // specification of degree and enrichement for the method
    const int deg_p = 1;
    const int delta_p = 2;

    //------------------------
    // run the convergence test
    //------------------------
    std::cout << "Running convergence tests on a triangular mesh  (eps= " << eps
              << ")\n";
    auto errors = projects::dpg::test::
        TestConververgenceUltraWeakDPGConvectionDiffusionDirichletBVP(
            reflev, u_exact, sigma, epsilon, beta, f, g, deg_p, delta_p,
            lf::base::RefEl::kTria());

    // output to a corresponding file
    const std::string file_name = "cs4/" + std::to_string(eps);
    std::ofstream file(file_name);
    for (auto [dofs, error_u, error_s, errorestimator] : errors) {
      file << dofs << ", " << error_u << ", " << error_s << ", "
           << errorestimator << '\n';
    }
    file.close();
  }

  return 0;
}